

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O2

void MULTICLASS::finish_example(vw *all,example *ec)

{
  uint32_t uVar1;
  int iVar2;
  namedlabels *this;
  _func_void_int_string_v_array<char> *p_Var3;
  v_array<char> vVar4;
  int *piVar5;
  float loss;
  float fVar6;
  substring sVar7;
  undefined8 in_stack_ffffffffffffff98;
  example *ec_00;
  int *piVar8;
  undefined1 *puVar9;
  undefined1 local_40 [16];
  
  uVar1 = (ec->l).multi.label;
  fVar6 = 0.0;
  if (uVar1 != (ec->pred).multiclass) {
    fVar6 = ec->weight;
  }
  loss = 0.0;
  if (uVar1 != 0xffffffff) {
    loss = fVar6;
  }
  ec_00 = ec;
  shared_data::update(all->sd,ec->test_only,uVar1 != 0xffffffff,loss,ec->weight,ec->num_features);
  piVar8 = (all->final_prediction_sink)._end;
  for (piVar5 = (all->final_prediction_sink)._begin; piVar5 != piVar8; piVar5 = piVar5 + 1) {
    iVar2 = *piVar5;
    this = all->sd->ldict;
    if (this == (namedlabels *)0x0) {
      (*all->print)(iVar2,(float)(ec_00->pred).multiclass,0.0,ec->tag);
    }
    else {
      sVar7 = namedlabels::get(this,(ec_00->pred).multiclass);
      p_Var3 = all->print_text;
      puVar9 = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffffb0,sVar7.begin,sVar7.end);
      vVar4._end = (char *)ec_00;
      vVar4._begin = (char *)in_stack_ffffffffffffff98;
      vVar4.end_array = (char *)piVar8;
      vVar4.erase_count = (size_t)puVar9;
      (*p_Var3)(iVar2,(string)ec->tag,vVar4);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    }
  }
  print_update<&MULTICLASS::direct_print_update>(all,ec_00,(ec_00->pred).multiclass);
  VW::finish_example(all,ec_00);
  return;
}

Assistant:

void finish_example(vw& all, example& ec)
{
  float loss = 0;
  if (ec.l.multi.label != (uint32_t)ec.pred.multiclass && ec.l.multi.label != (uint32_t)-1)
    loss = ec.weight;

  all.sd->update(ec.test_only, ec.l.multi.label != (uint32_t)-1, loss, ec.weight, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (!all.sd->ldict)
      all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);
    else
    {
      substring ss_pred = all.sd->ldict->get(ec.pred.multiclass);
      all.print_text(sink, string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.tag);
    }

  MULTICLASS::print_update<direct_print_update>(all, ec, ec.pred.multiclass);
  VW::finish_example(all, ec);
}